

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O0

uint __thiscall gss::innards::SVOBitset::count(SVOBitset *this)

{
  uint uVar1;
  _If_is_unsigned_integer<unsigned_long_long,_int> _Var2;
  SVOBitset *in_RDI;
  uint i_end;
  uint i;
  BitWord *b;
  uint result;
  uint local_1c;
  uint local_c;
  
  local_c = 0;
  _is_long(in_RDI);
  local_1c = 0;
  uVar1 = in_RDI->n_words;
  for (; local_1c < uVar1; local_1c = local_1c + 1) {
    _Var2 = std::popcount<unsigned_long_long>(0x147a8c);
    local_c = _Var2 + local_c;
  }
  return local_c;
}

Assistant:

auto count() const -> unsigned
        {
            unsigned result = 0;
            const BitWord * b = (_is_long() ? _data.long_data : _data.short_data);
            for (unsigned i = 0, i_end = n_words; i < i_end; ++i)
                result += popcount(b[i]);

            return result;
        }